

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O3

lm_trie_quant_t * lm_trie_quant_create(int order)

{
  lm_trie_quant_t *plVar1;
  float32 *pfVar2;
  long lVar3;
  ulong n_elem;
  long lVar4;
  
  plVar1 = (lm_trie_quant_t *)
           __ckd_calloc__(1,0xa8,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
                          ,0x83);
  lVar4 = (long)order;
  n_elem = (lVar4 - 2U) * 0x20000 | 0x10000;
  plVar1->nvalues = n_elem;
  pfVar2 = (float32 *)
           __ckd_calloc__(n_elem,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/lm_trie_quant.c"
                          ,0x86);
  plVar1->values = pfVar2;
  plVar1->prob_bits = '\x10';
  plVar1->bo_bits = '\x10';
  plVar1->prob_mask = 0xffff;
  plVar1->bo_mask = 0xffff;
  if (2 < order) {
    lVar3 = 0;
    do {
      *(float32 **)((long)&plVar1->tables[0][0].begin + lVar3) = pfVar2;
      *(float32 **)((long)&plVar1->tables[0][0].end + lVar3) = pfVar2 + 0x10000;
      *(float32 **)((long)&plVar1->tables[0][1].begin + lVar3) = pfVar2 + 0x10000;
      pfVar2 = pfVar2 + 0x20000;
      *(float32 **)((long)&plVar1->tables[0][1].end + lVar3) = pfVar2;
      lVar3 = lVar3 + 0x20;
    } while ((lVar4 - 2U & 0xffffffff) << 5 != lVar3);
  }
  plVar1->tables[lVar4 + -2][0].begin = pfVar2;
  plVar1->tables[lVar4 + -2][0].end = pfVar2 + 0x10000;
  plVar1->longest = plVar1->tables[lVar4 + -2];
  return plVar1;
}

Assistant:

lm_trie_quant_t *
lm_trie_quant_create(int order)
{
    float32 *start;
    int i;
    lm_trie_quant_t *quant =
        (lm_trie_quant_t *) ckd_calloc(1, sizeof(*quant));
    quant->nvalues = quant_size(order);
    quant->values =
        (float32 *) ckd_calloc(quant->nvalues, sizeof(*quant->values));

    quant->prob_bits = 16;
    quant->bo_bits = 16;
    quant->prob_mask = (1U << quant->prob_bits) - 1;
    quant->bo_mask = (1U << quant->bo_bits) - 1;

    start = (float32 *) (quant->values);
    for (i = 0; i < order - 2; i++) {
        bins_create(&quant->tables[i][0], quant->prob_bits, start);
        start += (1ULL << quant->prob_bits);
        bins_create(&quant->tables[i][1], quant->bo_bits, start);
        start += (1ULL << quant->bo_bits);
    }
    bins_create(&quant->tables[order - 2][0], quant->prob_bits, start);
    quant->longest = &quant->tables[order - 2][0];
    return quant;
}